

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
poplar::
map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_fkhash_nlm<int>_>::
expand_if_needed_(map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_fkhash_nlm<int>_>
                  *this,uint64_t *node_id)

{
  uint64_t *node_id_local;
  map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_fkhash_nlm<int>_>
  *this_local;
  
  return;
}

Assistant:

void expand_if_needed_(uint64_t& node_id) {
        if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
            if (!hash_trie_.needs_to_expand()) {
                return;
            }
            auto node_map = hash_trie_.expand();
            node_id = node_map[node_id];
            label_store_.expand(node_map);
        }
    }